

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError str2double(double *val,char *str)

{
  size_t sVar1;
  ParameterError PVar2;
  double dVar3;
  char *endptr;
  char *local_28;
  
  PVar2 = PARAM_BAD_NUMERIC;
  if (str != (char *)0x0) {
    dVar3 = strtod(str,&local_28);
    if (local_28 != str) {
      sVar1 = strlen(str);
      if (local_28 == str + sVar1) {
        *val = dVar3;
        PVar2 = PARAM_OK;
      }
    }
  }
  return PVar2;
}

Assistant:

ParameterError str2double(double *val, const char *str)
{
  if(str) {
    char *endptr;
    double num = strtod(str, &endptr);
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}